

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

void xmlDocDumpFormatMemoryEnc
               (xmlDocPtr out_doc,xmlChar **doc_txt_ptr,int *doc_txt_len,char *txt_encoding,
               int format)

{
  xmlCharEncodingHandlerPtr encoder;
  xmlOutputBufferPtr out;
  size_t sVar1;
  xmlChar *pxVar2;
  int len;
  xmlBufPtr buf;
  int iVar3;
  xmlSaveCtxt local_c8;
  
  if (doc_txt_ptr == (xmlChar **)0x0) {
    if (doc_txt_len != (int *)0x0) {
      *doc_txt_len = 0;
    }
  }
  else {
    *doc_txt_ptr = (xmlChar *)0x0;
    if (doc_txt_len != (int *)0x0) {
      *doc_txt_len = 0;
    }
    if (out_doc != (xmlDocPtr)0x0) {
      if ((txt_encoding == (char *)0x0) &&
         (txt_encoding = (char *)out_doc->encoding, (xmlChar *)txt_encoding == (xmlChar *)0x0)) {
        txt_encoding = (char *)0x0;
        encoder = (xmlCharEncodingHandlerPtr)0x0;
      }
      else {
        encoder = xmlFindCharEncodingHandler(txt_encoding);
        if (encoder == (xmlCharEncodingHandlerPtr)0x0) {
          xmlSaveErr(0x57b,(xmlNodePtr)out_doc,txt_encoding);
          return;
        }
      }
      out = xmlAllocOutputBuffer(encoder);
      if (out == (xmlOutputBufferPtr)0x0) {
        xmlSaveErrMemory("creating buffer");
        return;
      }
      memset(&local_c8,0,0x98);
      local_c8.format = (int)(format != 0);
      local_c8.encoding = (xmlChar *)txt_encoding;
      local_c8.buf = out;
      xmlSaveCtxtInit(&local_c8);
      local_c8.options._0_1_ = (byte)local_c8.options | 0x20;
      xmlDocContentDumpOutput(&local_c8,out_doc);
      xmlOutputBufferFlush(out);
      if (out->conv == (xmlBufPtr)0x0) {
        sVar1 = xmlBufUse(out->buffer);
        iVar3 = (int)sVar1;
        if (doc_txt_len != (int *)0x0) {
          *doc_txt_len = iVar3;
          iVar3 = 0;
        }
        buf = out->buffer;
      }
      else {
        sVar1 = xmlBufUse(out->conv);
        iVar3 = (int)sVar1;
        if (doc_txt_len != (int *)0x0) {
          *doc_txt_len = iVar3;
          iVar3 = 0;
        }
        buf = out->conv;
      }
      pxVar2 = xmlBufContent(buf);
      len = iVar3;
      if (doc_txt_len != (int *)0x0) {
        len = *doc_txt_len;
      }
      pxVar2 = xmlStrndup(pxVar2,len);
      *doc_txt_ptr = pxVar2;
      xmlOutputBufferClose(out);
      if (*doc_txt_ptr == (xmlChar *)0x0) {
        if (doc_txt_len == (int *)0x0) {
          if (iVar3 < 1) {
            return;
          }
        }
        else {
          if (*doc_txt_len < 1) {
            return;
          }
          *doc_txt_len = 0;
        }
        xmlSaveErrMemory("creating output");
      }
    }
  }
  return;
}

Assistant:

void
xmlDocDumpFormatMemoryEnc(xmlDocPtr out_doc, xmlChar **doc_txt_ptr,
		int * doc_txt_len, const char * txt_encoding,
		int format) {
    xmlSaveCtxt ctxt;
    int                         dummy = 0;
    xmlOutputBufferPtr          out_buff = NULL;
    xmlCharEncodingHandlerPtr   conv_hdlr = NULL;

    if (doc_txt_len == NULL) {
        doc_txt_len = &dummy;   /*  Continue, caller just won't get length */
    }

    if (doc_txt_ptr == NULL) {
        *doc_txt_len = 0;
        return;
    }

    *doc_txt_ptr = NULL;
    *doc_txt_len = 0;

    if (out_doc == NULL) {
        /*  No document, no output  */
        return;
    }

    /*
     *  Validate the encoding value, if provided.
     *  This logic is copied from xmlSaveFileEnc.
     */

    if (txt_encoding == NULL)
	txt_encoding = (const char *) out_doc->encoding;
    if (txt_encoding != NULL) {
	conv_hdlr = xmlFindCharEncodingHandler(txt_encoding);
	if ( conv_hdlr == NULL ) {
	    xmlSaveErr(XML_SAVE_UNKNOWN_ENCODING, (xmlNodePtr) out_doc,
		       txt_encoding);
	    return;
	}
    }

    if ((out_buff = xmlAllocOutputBuffer(conv_hdlr)) == NULL ) {
        xmlSaveErrMemory("creating buffer");
        return;
    }

    memset(&ctxt, 0, sizeof(ctxt));
    ctxt.buf = out_buff;
    ctxt.level = 0;
    ctxt.format = format ? 1 : 0;
    ctxt.encoding = (const xmlChar *) txt_encoding;
    xmlSaveCtxtInit(&ctxt);
    ctxt.options |= XML_SAVE_AS_XML;
    xmlDocContentDumpOutput(&ctxt, out_doc);
    xmlOutputBufferFlush(out_buff);
    if (out_buff->conv != NULL) {
	*doc_txt_len = xmlBufUse(out_buff->conv);
	*doc_txt_ptr = xmlStrndup(xmlBufContent(out_buff->conv), *doc_txt_len);
    } else {
	*doc_txt_len = xmlBufUse(out_buff->buffer);
	*doc_txt_ptr = xmlStrndup(xmlBufContent(out_buff->buffer),*doc_txt_len);
    }
    (void)xmlOutputBufferClose(out_buff);

    if ((*doc_txt_ptr == NULL) && (*doc_txt_len > 0)) {
        *doc_txt_len = 0;
        xmlSaveErrMemory("creating output");
    }

    return;
}